

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineShape.h
# Opt level: O1

void __thiscall chrono::ChLineShape::~ChLineShape(ChLineShape *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChLineShape_00b69d28;
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  this_00 = (this->gline).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChVisualShape_00b6a168;
  std::
  vector<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
  ::~vector(&(this->super_ChVisualShape).material_list);
  return;
}

Assistant:

virtual ~ChLineShape() {}